

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat operator*(double value,Mat *Matrix)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  double *pdVar5;
  int i;
  double *in_RDX;
  int *in_RSI;
  Mat MVar6;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  Matrix->n_rows_ = iVar1;
  Matrix->n_cols_ = iVar2;
  uVar4 = iVar2 * iVar1;
  if ((int)uVar4 < 1) {
    Matrix->v_ = (double *)0x0;
  }
  else {
    pdVar5 = (double *)operator_new__((long)(ulong)uVar4 * 8);
    Matrix->v_ = pdVar5;
    lVar3 = *(long *)(in_RSI + 2);
    in_RDX = (double *)0x0;
    do {
      pdVar5[(long)in_RDX] = *(double *)(lVar3 + (long)in_RDX * 8) * value;
      in_RDX = (double *)((long)in_RDX + 1);
    } while ((double *)(ulong)uVar4 != in_RDX);
  }
  MVar6.v_ = in_RDX;
  MVar6._0_8_ = Matrix;
  return MVar6;
}

Assistant:

Mat operator*(double value, const Mat& Matrix)
{
	int nEl = Matrix.n_rows_*Matrix.n_cols_;
	Mat Aux(Matrix.n_rows_, Matrix.n_cols_);
	for (int i=0; i<nEl; i++) 	
		Aux.v_[i] = value*Matrix.v_[i];
	return Aux;
}